

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPIRVShaderResources.cpp
# Opt level: O0

void __thiscall
Diligent::SPIRVShaderResources::SPIRVShaderResources
          (SPIRVShaderResources *this,IMemoryAllocator *Allocator,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *spirv_binary,ShaderDesc *shaderDesc,
          char *CombinedSamplerSuffix,bool LoadShaderStageInputs,bool LoadUniformBufferReflection,
          string *EntryPoint)

{
  SmallVector<diligent_spirv_cross::Resource,_8UL> *this_00;
  undefined *puVar1;
  __node_base_ptr Res;
  bool bVar2;
  Uint32 UVar3;
  TypedID<(diligent_spirv_cross::Types)2> id;
  uint32_t uVar4;
  ParsedIR *pPVar5;
  EntryPoint *pEVar6;
  ulong uVar7;
  undefined8 uVar8;
  long lVar9;
  const_iterator ppSVar10;
  Resource *pRVar11;
  size_t sVar12;
  Char *pCVar13;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  VectorView<diligent_spirv_cross::Resource> *pVVar15;
  size_t sVar16;
  string *psVar17;
  SPIRType *pSVar18;
  SPIRVShaderResourceAttribs *pSVar19;
  size_t sVar20;
  char (*Args_1) [44];
  SPIRVShaderStageInputAttribs *this_02;
  reference pvVar21;
  char (*pacVar22) [36];
  const_iterator RangeStart;
  const_iterator RangeEnd;
  IMemoryAllocator *RawAllocator;
  char *Args_1_00;
  char *Args_2;
  char (*in_stack_ffffffffffffc6a8) [17];
  undefined1 local_36d0 [16];
  undefined1 local_36c0 [8];
  string msg_13;
  string msg_12;
  undefined1 local_3678 [4];
  uint32_t i;
  string msg_11;
  string msg_10;
  string *Semantic_1;
  Resource *Input_1;
  Resource *__end2_11;
  Resource *__begin2_11;
  SmallVector<diligent_spirv_cross::Resource,_8UL> *__range2_11;
  undefined1 local_35f8 [4];
  Uint32 CurrStageInput;
  string msg_9;
  Resource *AccelStruct;
  Resource *__end2_10;
  Resource *__begin2_10;
  SmallVector<diligent_spirv_cross::Resource,_8UL> *__range2_10;
  undefined1 local_35b0 [4];
  Uint32 CurrAccelStruct;
  string msg_8;
  Resource *SubpassInput;
  Resource *__end2_9;
  Resource *__begin2_9;
  SmallVector<diligent_spirv_cross::Resource,_8UL> *__range2_9;
  undefined1 local_3568 [4];
  Uint32 CurrSubpassInput;
  string msg_7;
  ResourceType ResType_3;
  SPIRType *type_2;
  Resource *SepImg;
  Resource *__end2_8;
  Resource *__begin2_8;
  SmallVector<diligent_spirv_cross::Resource,_8UL> *__range2_8;
  undefined1 local_3510 [4];
  Uint32 CurrSepImg;
  string msg_6;
  Resource *SepSam;
  Resource *__end2_7;
  Resource *__begin2_7;
  SmallVector<diligent_spirv_cross::Resource,_8UL> *__range2_7;
  undefined1 local_34c8 [4];
  Uint32 CurrSepSmpl;
  string msg_5;
  Resource *AC;
  Resource *__end2_6;
  Resource *__begin2_6;
  SmallVector<diligent_spirv_cross::Resource,_8UL> *__range2_6;
  undefined1 local_3480 [4];
  Uint32 CurrAC;
  string msg_4;
  ResourceType ResType_2;
  SPIRType *type_1;
  Resource *Img;
  Resource *__end2_5;
  Resource *__begin2_5;
  SmallVector<diligent_spirv_cross::Resource,_8UL> *__range2_5;
  undefined1 local_3428 [4];
  Uint32 CurrImg;
  string msg_3;
  ResourceType ResType_1;
  SPIRType *type;
  Resource *SmplImg;
  Resource *__end2_4;
  Resource *__begin2_4;
  SmallVector<diligent_spirv_cross::Resource,_8UL> *__range2_4;
  undefined1 local_33d0 [4];
  Uint32 CurrSmplImg;
  string msg_2;
  size_t Stride;
  size_t Size_1;
  SPIRType *Type_1;
  undefined1 local_3388 [2];
  ResourceType ResType;
  bool IsReadOnly;
  Bitset BufferFlags;
  Resource *SB;
  Resource *__end2_3;
  Resource *__begin2_3;
  SmallVector<diligent_spirv_cross::Resource,_8UL> *__range2_3;
  undefined1 local_3320 [4];
  Uint32 CurrSB;
  string msg_1;
  size_t Size;
  SPIRType *Type;
  string *name;
  Resource *UB;
  Resource *__end2_2;
  Resource *__begin2_2;
  SmallVector<diligent_spirv_cross::Resource,_8UL> *__range2_2;
  undefined1 local_3290 [4];
  Uint32 CurrUB;
  vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
  UBReflections;
  StringPool ResourceNamesPool;
  ResourceCounters ResCounters;
  string _msg_2;
  string _msg_1;
  string *Semantic;
  Resource *Input;
  Resource *__end3;
  Resource *__begin3;
  SmallVector<diligent_spirv_cross::Resource,_8UL> *__range3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ext;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__end2_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__begin2_1;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *__range2_1;
  bool HlslFunctionality1;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *Extensions;
  undefined1 local_3180 [4];
  Uint32 NumShaderStageInputs;
  string msg;
  Resource *res;
  Resource *__end2;
  Resource *__begin2;
  SmallVector<diligent_spirv_cross::Resource,_8UL> *__range2;
  SmallVector<diligent_spirv_cross::Resource,_8UL> *pResType;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  char *local_3120;
  char *local_3118;
  char *local_3110;
  char *local_3108;
  char *local_3100;
  char *local_30f8;
  char *local_30f0;
  initializer_list<diligent_spirv_cross::SmallVector<diligent_spirv_cross::Resource,_8UL>_*>
  local_30e8;
  initializer_list<diligent_spirv_cross::SmallVector<diligent_spirv_cross::Resource,_8UL>_*>
  *local_30d8;
  initializer_list<diligent_spirv_cross::SmallVector<diligent_spirv_cross::Resource,_8UL>_*>
  *__range1_2;
  Resource *ub;
  Resource *__end1_1;
  Resource *__begin1_1;
  SmallVector<diligent_spirv_cross::Resource,_8UL> *__range1_1;
  size_t ResourceNamesPoolSize;
  ShaderResources resources;
  Char *local_16a0;
  undefined1 local_1698 [8];
  string _msg;
  EntryPoint *CurrEntryPoint;
  EntryPoint *__end1;
  EntryPoint *__begin1;
  SmallVector<diligent_spirv_cross::EntryPoint,_8UL> *__range1;
  SmallVector<diligent_spirv_cross::EntryPoint,_8UL> EntryPoints;
  undefined1 local_14f8 [4];
  ExecutionModel ExecutionModel;
  Compiler Compiler;
  Source ParsedIRSource;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_878;
  undefined1 local_860 [8];
  Parser parser;
  bool LoadUniformBufferReflection_local;
  bool LoadShaderStageInputs_local;
  char *CombinedSamplerSuffix_local;
  ShaderDesc *shaderDesc_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *spirv_binary_local;
  IMemoryAllocator *Allocator_local;
  SPIRVShaderResources *this_local;
  
  parser.forward_pointer_fixups.stack_storage.aligned_char[0x3e] = LoadUniformBufferReflection;
  Args_2 = CombinedSamplerSuffix;
  parser.forward_pointer_fixups.stack_storage.aligned_char[0x3f] = LoadShaderStageInputs;
  std::unique_ptr<void,Diligent::STDDeleter<void,Diligent::IMemoryAllocator>>::
  unique_ptr<Diligent::STDDeleter<void,Diligent::IMemoryAllocator>,void>
            ((unique_ptr<void,Diligent::STDDeleter<void,Diligent::IMemoryAllocator>> *)this);
  std::unique_ptr<void,Diligent::STDDeleter<void,Diligent::IMemoryAllocator>>::
  unique_ptr<Diligent::STDDeleter<void,Diligent::IMemoryAllocator>,void>
            ((unique_ptr<void,Diligent::STDDeleter<void,Diligent::IMemoryAllocator>> *)
             &this->m_UBReflectionBuffer);
  this->m_CombinedSamplerSuffix = (char *)0x0;
  this->m_ShaderName = (char *)0x0;
  this->m_StorageBufferOffset = 0;
  this->m_StorageImageOffset = 0;
  this->m_SampledImageOffset = 0;
  this->m_AtomicCounterOffset = 0;
  this->m_SeparateSamplerOffset = 0;
  this->m_SeparateImageOffset = 0;
  this->m_InputAttachmentOffset = 0;
  this->m_AccelStructOffset = 0;
  this->m_TotalResources = 0;
  this->m_NumShaderStageInputs = 0;
  this->m_ShaderType = shaderDesc->ShaderType;
  (this->m_ComputeGroupSize)._M_elems[2] = 0;
  (this->m_ComputeGroupSize)._M_elems[0] = 0;
  (this->m_ComputeGroupSize)._M_elems[1] = 0;
  this->m_IsHLSLSource = false;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_878,spirv_binary);
  diligent_spirv_cross::Parser::Parser
            ((Parser *)local_860,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_878);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_878);
  diligent_spirv_cross::Parser::parse((Parser *)local_860);
  pPVar5 = diligent_spirv_cross::Parser::get_parsed_ir((Parser *)local_860);
  Compiler.declared_block_names._M_h._M_single_bucket = *(__node_base_ptr *)&pPVar5->source;
  Args_1_00 = (char *)(CONCAT71(SUB87(Compiler.declared_block_names._M_h._M_single_bucket,1),
                                Compiler.declared_block_names._M_h._M_single_bucket._6_1_) &
                      0xffffffffffffff01);
  this->m_IsHLSLSource = SUB81(Args_1_00,0);
  pPVar5 = diligent_spirv_cross::Parser::get_parsed_ir((Parser *)local_860);
  diligent_spirv_cross::Compiler::Compiler((Compiler *)local_14f8,pPVar5);
  EntryPoints.stack_storage.aligned_char._316_4_ =
       ShaderTypeToSpvExecutionModel(shaderDesc->ShaderType);
  diligent_spirv_cross::Compiler::get_entry_points_and_stages
            ((SmallVector<diligent_spirv_cross::EntryPoint,_8UL> *)&__range1,(Compiler *)local_14f8)
  ;
  __end1 = diligent_spirv_cross::VectorView<diligent_spirv_cross::EntryPoint>::begin
                     ((VectorView<diligent_spirv_cross::EntryPoint> *)&__range1);
  pEVar6 = diligent_spirv_cross::VectorView<diligent_spirv_cross::EntryPoint>::end
                     ((VectorView<diligent_spirv_cross::EntryPoint> *)&__range1);
  for (; __end1 != pEVar6; __end1 = __end1 + 1) {
    _msg.field_2._8_8_ = __end1;
    if (__end1->execution_model == EntryPoints.stack_storage.aligned_char._316_4_) {
      uVar7 = std::__cxx11::string::empty();
      if ((uVar7 & 1) == 0) {
        local_16a0 = GetShaderTypeLiteralName(shaderDesc->ShaderType);
        Args_1_00 = " found in SPIRV binary for shader \'";
        Args_2 = (char *)shaderDesc;
        FormatString<char[35],char_const*,char[36],char_const*,char[20],std::__cxx11::string,char[17]>
                  ((string *)local_1698,(Diligent *)"More than one entry point of type ",
                   (char (*) [35])&local_16a0,(char **)" found in SPIRV binary for shader \'",
                   (char (*) [36])shaderDesc,(char **)"\'. The first one (\'",
                   (char (*) [20])EntryPoint,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "\') will be used.",in_stack_ffffffffffffc6a8);
        puVar1 = DebugMessageCallback;
        if (DebugMessageCallback != (undefined *)0x0) {
          uVar8 = std::__cxx11::string::c_str();
          Args_1_00 = (char *)0x0;
          Args_2 = Args_1_00;
          (*(code *)puVar1)(1,uVar8,0);
        }
        std::__cxx11::string::~string((string *)local_1698);
      }
      else {
        std::__cxx11::string::operator=((string *)EntryPoint,(string *)_msg.field_2._8_8_);
      }
    }
  }
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) != 0) {
    resources.builtin_outputs.stack_storage.aligned_char._440_8_ =
         GetShaderTypeLiteralName(shaderDesc->ShaderType);
    Args_2 = "Unable to find entry point of type ";
    Args_1_00 = (char *)0x19c;
    LogError<true,char[36],char_const*,char[30],char_const*,char[2]>
              (false,"SPIRVShaderResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
               ,0x19c,(char (*) [36])"Unable to find entry point of type ",
               (char **)(resources.builtin_outputs.stack_storage.aligned_char + 0x1b8),
               (char (*) [30])0xe6b40e,(char **)shaderDesc,(char (*) [2])0xe2ad32);
  }
  diligent_spirv_cross::Compiler::set_entry_point
            ((Compiler *)local_14f8,EntryPoint,EntryPoints.stack_storage.aligned_char._316_4_);
  diligent_spirv_cross::Compiler::get_shader_resources
            ((ShaderResources *)&ResourceNamesPoolSize,(Compiler *)local_14f8);
  __range1_1 = (SmallVector<diligent_spirv_cross::Resource,_8UL> *)0x0;
  __begin1_1 = (Resource *)&ResourceNamesPoolSize;
  __end1_1 = diligent_spirv_cross::VectorView<diligent_spirv_cross::Resource>::begin
                       ((VectorView<diligent_spirv_cross::Resource> *)__begin1_1);
  ub = diligent_spirv_cross::VectorView<diligent_spirv_cross::Resource>::end
                 ((VectorView<diligent_spirv_cross::Resource> *)__begin1_1);
  for (; __end1_1 != ub; __end1_1 = __end1_1 + 1) {
    __range1_2 = (initializer_list<diligent_spirv_cross::SmallVector<diligent_spirv_cross::Resource,_8UL>_*>
                  *)__end1_1;
    GetUBName_abi_cxx11_
              ((Compiler *)local_14f8,__end1_1,
               (Source *)&Compiler.declared_block_names._M_h._M_single_bucket);
    lVar9 = std::__cxx11::string::length();
    __range1_1 = (SmallVector<diligent_spirv_cross::Resource,_8UL> *)
                 ((__range1_1->stack_storage).aligned_char + lVar9 + -0x17);
  }
  __begin1_2 = (const_iterator)(resources.uniform_buffers.stack_storage.aligned_char + 0x178);
  local_3120 = resources.subpass_inputs.stack_storage.aligned_char + 0x178;
  local_3118 = resources.storage_images.stack_storage.aligned_char + 0x178;
  local_3110 = resources.sampled_images.stack_storage.aligned_char + 0x178;
  local_3108 = resources.shader_record_buffers.stack_storage.aligned_char + 0x178;
  local_3100 = resources.separate_images.stack_storage.aligned_char + 0x178;
  local_30f8 = resources.stage_outputs.stack_storage.aligned_char + 0x178;
  local_30f0 = resources.atomic_counters.stack_storage.aligned_char + 0x178;
  local_30e8._M_array = (iterator)&__begin1_2;
  local_30e8._M_len = 8;
  local_30d8 = &local_30e8;
  __end1_2 = std::
             initializer_list<diligent_spirv_cross::SmallVector<diligent_spirv_cross::Resource,_8UL>_*>
             ::begin(local_30d8);
  ppSVar10 = std::
             initializer_list<diligent_spirv_cross::SmallVector<diligent_spirv_cross::Resource,_8UL>_*>
             ::end(local_30d8);
  for (; __end1_2 != ppSVar10; __end1_2 = __end1_2 + 1) {
    this_00 = *__end1_2;
    __end2 = diligent_spirv_cross::VectorView<diligent_spirv_cross::Resource>::begin
                       (&this_00->super_VectorView<diligent_spirv_cross::Resource>);
    pRVar11 = diligent_spirv_cross::VectorView<diligent_spirv_cross::Resource>::end
                        (&this_00->super_VectorView<diligent_spirv_cross::Resource>);
    for (; __end2 != pRVar11; __end2 = __end2 + 1) {
      msg.field_2._8_8_ = __end2;
      lVar9 = std::__cxx11::string::length();
      __range1_1 = (SmallVector<diligent_spirv_cross::Resource,_8UL> *)
                   ((__range1_1->stack_storage).aligned_char + lVar9 + -0x17);
    }
  }
  if (CombinedSamplerSuffix != (char *)0x0) {
    sVar12 = strlen(CombinedSamplerSuffix);
    __range1_1 = (SmallVector<diligent_spirv_cross::Resource,_8UL> *)
                 ((__range1_1->stack_storage).aligned_char + (sVar12 - 0x17));
  }
  if ((shaderDesc->super_DeviceObjectAttribs).Name == (Char *)0x0) {
    FormatString<char[26],char[27]>
              ((string *)local_3180,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"shaderDesc.Name != nullptr",(char (*) [27])Args_1_00);
    pCVar13 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar13,"SPIRVShaderResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
               ,0x1bc);
    std::__cxx11::string::~string((string *)local_3180);
  }
  sVar12 = strlen((shaderDesc->super_DeviceObjectAttribs).Name);
  __range1_1 = (SmallVector<diligent_spirv_cross::Resource,_8UL> *)
               ((__range1_1->stack_storage).aligned_char + (sVar12 - 0x17));
  Extensions._4_4_ = 0;
  if (((this->m_IsHLSLSource & 1U) == 0) ||
     (bVar2 = diligent_spirv_cross::VectorView<diligent_spirv_cross::Resource>::empty
                        ((VectorView<diligent_spirv_cross::Resource> *)
                         (resources.storage_buffers.stack_storage.aligned_char + 0x178)), bVar2)) {
    parser.forward_pointer_fixups.stack_storage.aligned_char[0x3f] = '\0';
  }
  if ((parser.forward_pointer_fixups.stack_storage.aligned_char[0x3f] & 1U) != 0) {
    this_01 = diligent_spirv_cross::Compiler::get_declared_extensions_abi_cxx11_
                        ((Compiler *)local_14f8);
    __range2_1._7_1_ = false;
    __end2_1 = diligent_spirv_cross::
               VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::begin(&this_01->
                        super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      );
    pbVar14 = diligent_spirv_cross::
              VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::end(&this_01->
                     super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   );
    while ((__end2_1 != pbVar14 &&
           (__range2_1._7_1_ = std::operator==(__end2_1,"SPV_GOOGLE_hlsl_functionality1"),
           !__range2_1._7_1_))) {
      __end2_1 = __end2_1 + 1;
    }
    if (__range2_1._7_1_ == false) {
      parser.forward_pointer_fixups.stack_storage.aligned_char[0x3f] = '\0';
      if ((this->m_IsHLSLSource & 1U) != 0) {
        FormatString<char[28],char_const*,char[366]>
                  ((string *)&ResCounters.NumInptAtts,(Diligent *)"SPIRV byte code of shader \'",
                   (char (*) [28])shaderDesc,
                   (char **)
                   "\' does not use SPV_GOOGLE_hlsl_functionality1 extension. As a result, it is not possible to get semantics of shader inputs and map them to proper locations. The shader will still work correctly if all attributes are declared in ascending order without any gaps. Enable SPV_GOOGLE_hlsl_functionality1 in your compiler to allow proper mapping of vertex shader inputs."
                   ,(char (*) [366])Args_2);
        puVar1 = DebugMessageCallback;
        if (DebugMessageCallback != (undefined *)0x0) {
          uVar8 = std::__cxx11::string::c_str();
          (*(code *)puVar1)(1,uVar8,0);
        }
        std::__cxx11::string::~string((string *)&ResCounters.NumInptAtts);
      }
    }
    else {
      pVVar15 = (VectorView<diligent_spirv_cross::Resource> *)
                (resources.storage_buffers.stack_storage.aligned_char + 0x178);
      __end3 = diligent_spirv_cross::VectorView<diligent_spirv_cross::Resource>::begin(pVVar15);
      pRVar11 = diligent_spirv_cross::VectorView<diligent_spirv_cross::Resource>::end(pVVar15);
      for (; __end3 != pRVar11; __end3 = __end3 + 1) {
        bVar2 = diligent_spirv_cross::Compiler::has_decoration
                          ((Compiler *)local_14f8,(ID)(__end3->id).id,DecorationHlslSemanticGOOGLE);
        if (bVar2) {
          diligent_spirv_cross::Compiler::get_decoration_string_abi_cxx11_
                    ((Compiler *)local_14f8,(ID)(__end3->id).id,DecorationHlslSemanticGOOGLE);
          lVar9 = std::__cxx11::string::length();
          __range1_1 = (SmallVector<diligent_spirv_cross::Resource,_8UL> *)
                       ((__range1_1->stack_storage).aligned_char + lVar9 + -0x17);
          Extensions._4_4_ = Extensions._4_4_ + 1;
        }
        else {
          FormatString<char[15],std::__cxx11::string,char[141]>
                    ((string *)((long)&_msg_2.field_2 + 8),(Diligent *)"Shader input \'",
                     (char (*) [15])&__end3->name,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "\' does not have DecorationHlslSemanticGOOGLE decoration, which is unexpected as the shader declares SPV_GOOGLE_hlsl_functionality1 extension"
                     ,(char (*) [141])Args_2);
          puVar1 = DebugMessageCallback;
          if (DebugMessageCallback != (undefined *)0x0) {
            uVar8 = std::__cxx11::string::c_str();
            Args_2 = (char *)0x0;
            (*(code *)puVar1)(2,uVar8,0);
          }
          std::__cxx11::string::~string((string *)(_msg_2.field_2._M_local_buf + 8));
        }
      }
    }
  }
  ResourceCounters::ResourceCounters
            ((ResourceCounters *)((long)&ResourceNamesPool.m_pAllocator + 4));
  sVar16 = diligent_spirv_cross::VectorView<diligent_spirv_cross::Resource>::size
                     ((VectorView<diligent_spirv_cross::Resource> *)&ResourceNamesPoolSize);
  ResourceNamesPool.m_pAllocator._4_4_ = (undefined4)sVar16;
  diligent_spirv_cross::VectorView<diligent_spirv_cross::Resource>::size
            ((VectorView<diligent_spirv_cross::Resource> *)
             (resources.uniform_buffers.stack_storage.aligned_char + 0x178));
  sVar16 = diligent_spirv_cross::VectorView<diligent_spirv_cross::Resource>::size
                     ((VectorView<diligent_spirv_cross::Resource> *)
                      (resources.subpass_inputs.stack_storage.aligned_char + 0x178));
  ResCounters.NumUBs = (Uint32)sVar16;
  sVar16 = diligent_spirv_cross::VectorView<diligent_spirv_cross::Resource>::size
                     ((VectorView<diligent_spirv_cross::Resource> *)
                      (resources.storage_images.stack_storage.aligned_char + 0x178));
  ResCounters.NumSBs = (Uint32)sVar16;
  sVar16 = diligent_spirv_cross::VectorView<diligent_spirv_cross::Resource>::size
                     ((VectorView<diligent_spirv_cross::Resource> *)
                      (resources.sampled_images.stack_storage.aligned_char + 0x178));
  ResCounters.NumImgs = (Uint32)sVar16;
  sVar16 = diligent_spirv_cross::VectorView<diligent_spirv_cross::Resource>::size
                     ((VectorView<diligent_spirv_cross::Resource> *)
                      (resources.separate_images.stack_storage.aligned_char + 0x178));
  ResCounters.NumSmpldImgs = (Uint32)sVar16;
  sVar16 = diligent_spirv_cross::VectorView<diligent_spirv_cross::Resource>::size
                     ((VectorView<diligent_spirv_cross::Resource> *)
                      (resources.shader_record_buffers.stack_storage.aligned_char + 0x178));
  ResCounters.NumACs = (Uint32)sVar16;
  sVar16 = diligent_spirv_cross::VectorView<diligent_spirv_cross::Resource>::size
                     ((VectorView<diligent_spirv_cross::Resource> *)
                      (resources.stage_outputs.stack_storage.aligned_char + 0x178));
  ResCounters.NumSepSmplrs = (Uint32)sVar16;
  sVar16 = diligent_spirv_cross::VectorView<diligent_spirv_cross::Resource>::size
                     ((VectorView<diligent_spirv_cross::Resource> *)
                      (resources.atomic_counters.stack_storage.aligned_char + 0x178));
  ResCounters.NumSepImgs = (Uint32)sVar16;
  StringPool::StringPool
            ((StringPool *)
             &UBReflections.
              super__Vector_base<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Initialize(this,Allocator,(ResourceCounters *)((long)&ResourceNamesPool.m_pAllocator + 4),
             Extensions._4_4_,(size_t)__range1_1,
             (StringPool *)
             &UBReflections.
              super__Vector_base<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>::
  vector((vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
          *)local_3290);
  __range2_2._4_4_ = 0;
  __end2_2 = diligent_spirv_cross::VectorView<diligent_spirv_cross::Resource>::begin
                       ((VectorView<diligent_spirv_cross::Resource> *)&ResourceNamesPoolSize);
  pRVar11 = diligent_spirv_cross::VectorView<diligent_spirv_cross::Resource>::end
                      ((VectorView<diligent_spirv_cross::Resource> *)&ResourceNamesPoolSize);
  for (; __end2_2 != pRVar11; __end2_2 = __end2_2 + 1) {
    psVar17 = GetUBName_abi_cxx11_
                        ((Compiler *)local_14f8,__end2_2,
                         (Source *)&Compiler.declared_block_names._M_h._M_single_bucket);
    pSVar18 = diligent_spirv_cross::Compiler::get_type
                        ((Compiler *)local_14f8,(TypeID)(__end2_2->type_id).id);
    sVar16 = diligent_spirv_cross::Compiler::get_declared_struct_size
                       ((Compiler *)local_14f8,pSVar18);
    pSVar19 = GetUB(this,__range2_2._4_4_);
    pCVar13 = StringPool::CopyString
                        ((StringPool *)
                         &UBReflections.
                          super__Vector_base<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,psVar17);
    SPIRVShaderResourceAttribs::SPIRVShaderResourceAttribs
              (pSVar19,(Compiler *)local_14f8,__end2_2,pCVar13,UniformBuffer,(Uint32)sVar16,0);
    if ((parser.forward_pointer_fixups.stack_storage.aligned_char[0x3e] & 1U) != 0) {
      LoadUBReflection((ShaderCodeBufferDescX *)((long)&msg_1.field_2 + 8),(Compiler *)local_14f8,
                       __end2_2,(bool)(this->m_IsHLSLSource & 1));
      std::vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
      ::emplace_back<Diligent::ShaderCodeBufferDescX>
                ((vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
                  *)local_3290,(ShaderCodeBufferDescX *)((long)&msg_1.field_2 + 8));
      ShaderCodeBufferDescX::~ShaderCodeBufferDescX
                ((ShaderCodeBufferDescX *)((long)&msg_1.field_2 + 8));
    }
    __range2_2._4_4_ = __range2_2._4_4_ + 1;
  }
  UVar3 = GetNumUBs(this);
  if (__range2_2._4_4_ != UVar3) {
    FormatString<char[26],char[22]>
              ((string *)local_3320,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CurrUB == GetNumUBs()",(char (*) [22])(ulong)UVar3);
    pCVar13 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar13,"SPIRVShaderResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
               ,0x214);
    std::__cxx11::string::~string((string *)local_3320);
  }
  __range2_3._4_4_ = 0;
  pVVar15 = (VectorView<diligent_spirv_cross::Resource> *)
            (resources.uniform_buffers.stack_storage.aligned_char + 0x178);
  __end2_3 = diligent_spirv_cross::VectorView<diligent_spirv_cross::Resource>::begin(pVVar15);
  pRVar11 = diligent_spirv_cross::VectorView<diligent_spirv_cross::Resource>::end(pVVar15);
  for (; __end2_3 != pRVar11; __end2_3 = __end2_3 + 1) {
    BufferFlags.higher._M_h._M_single_bucket = (__node_base_ptr)__end2_3;
    id = diligent_spirv_cross::TypedID::operator_cast_to_TypedID((TypedID *)__end2_3);
    diligent_spirv_cross::Compiler::get_buffer_block_flags
              ((Bitset *)local_3388,(Compiler *)local_14f8,(VariableID)id.id);
    bVar2 = diligent_spirv_cross::Bitset::get((Bitset *)local_3388,0x18);
    pSVar18 = diligent_spirv_cross::Compiler::get_type
                        ((Compiler *)local_14f8,
                         (TypeID)*(uint32_t *)
                                  ((long)&(BufferFlags.higher._M_h._M_single_bucket)->_M_nxt + 4));
    sVar16 = diligent_spirv_cross::Compiler::get_declared_struct_size
                       ((Compiler *)local_14f8,pSVar18);
    sVar20 = diligent_spirv_cross::Compiler::get_declared_struct_size_runtime_array
                       ((Compiler *)local_14f8,pSVar18,1);
    msg_2.field_2._8_8_ = sVar20 - sVar16;
    pSVar19 = GetSB(this,__range2_3._4_4_);
    Res = BufferFlags.higher._M_h._M_single_bucket;
    pCVar13 = StringPool::CopyString
                        ((StringPool *)
                         &UBReflections.
                          super__Vector_base<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (String *)(BufferFlags.higher._M_h._M_single_bucket + 2));
    SPIRVShaderResourceAttribs::SPIRVShaderResourceAttribs
              (pSVar19,(Compiler *)local_14f8,(Resource *)Res,pCVar13,RWStorageBuffer - bVar2,
               (Uint32)sVar16,(Uint32)msg_2.field_2._8_8_);
    diligent_spirv_cross::Bitset::~Bitset((Bitset *)local_3388);
    __range2_3._4_4_ = __range2_3._4_4_ + 1;
  }
  UVar3 = GetNumSBs(this);
  if (__range2_3._4_4_ != UVar3) {
    FormatString<char[26],char[22]>
              ((string *)local_33d0,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CurrSB == GetNumSBs()",(char (*) [22])(ulong)UVar3);
    pCVar13 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar13,"SPIRVShaderResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
               ,0x22d);
    std::__cxx11::string::~string((string *)local_33d0);
  }
  __range2_4._4_4_ = 0;
  pVVar15 = (VectorView<diligent_spirv_cross::Resource> *)
            (resources.storage_images.stack_storage.aligned_char + 0x178);
  __end2_4 = diligent_spirv_cross::VectorView<diligent_spirv_cross::Resource>::begin(pVVar15);
  pRVar11 = diligent_spirv_cross::VectorView<diligent_spirv_cross::Resource>::end(pVVar15);
  for (; __end2_4 != pRVar11; __end2_4 = __end2_4 + 1) {
    msg_3.field_2._12_4_ = (__end2_4->type_id).id;
    pSVar18 = diligent_spirv_cross::Compiler::get_type
                        ((Compiler *)local_14f8,(TypeID)msg_3.field_2._12_4_);
    msg_3.field_2._M_local_buf[0xb] = ((pSVar18->image).dim != Buffer) * '\x03' + '\x03';
    pSVar19 = GetSmpldImg(this,__range2_4._4_4_);
    pCVar13 = StringPool::CopyString
                        ((StringPool *)
                         &UBReflections.
                          super__Vector_base<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,&__end2_4->name);
    SPIRVShaderResourceAttribs::SPIRVShaderResourceAttribs
              (pSVar19,(Compiler *)local_14f8,__end2_4,pCVar13,msg_3.field_2._M_local_buf[0xb],0,0);
    __range2_4._4_4_ = __range2_4._4_4_ + 1;
  }
  UVar3 = GetNumSmpldImgs(this);
  if (__range2_4._4_4_ != UVar3) {
    FormatString<char[26],char[33]>
              ((string *)local_3428,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CurrSmplImg == GetNumSmpldImgs()",(char (*) [33])(ulong)UVar3);
    pCVar13 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar13,"SPIRVShaderResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
               ,0x240);
    std::__cxx11::string::~string((string *)local_3428);
  }
  __range2_5._4_4_ = 0;
  pVVar15 = (VectorView<diligent_spirv_cross::Resource> *)
            (resources.subpass_inputs.stack_storage.aligned_char + 0x178);
  __end2_5 = diligent_spirv_cross::VectorView<diligent_spirv_cross::Resource>::begin(pVVar15);
  pRVar11 = diligent_spirv_cross::VectorView<diligent_spirv_cross::Resource>::end(pVVar15);
  for (; __end2_5 != pRVar11; __end2_5 = __end2_5 + 1) {
    msg_4.field_2._12_4_ = (__end2_5->type_id).id;
    pSVar18 = diligent_spirv_cross::Compiler::get_type
                        ((Compiler *)local_14f8,(TypeID)msg_4.field_2._12_4_);
    msg_4.field_2._M_local_buf[0xb] = (pSVar18->image).dim == Buffer ^ 5;
    pSVar19 = GetImg(this,__range2_5._4_4_);
    pCVar13 = StringPool::CopyString
                        ((StringPool *)
                         &UBReflections.
                          super__Vector_base<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,&__end2_5->name);
    SPIRVShaderResourceAttribs::SPIRVShaderResourceAttribs
              (pSVar19,(Compiler *)local_14f8,__end2_5,pCVar13,msg_4.field_2._M_local_buf[0xb],0,0);
    __range2_5._4_4_ = __range2_5._4_4_ + 1;
  }
  UVar3 = GetNumImgs(this);
  if (__range2_5._4_4_ != UVar3) {
    FormatString<char[26],char[24]>
              ((string *)local_3480,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CurrImg == GetNumImgs()",(char (*) [24])(ulong)UVar3);
    pCVar13 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar13,"SPIRVShaderResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
               ,0x253);
    std::__cxx11::string::~string((string *)local_3480);
  }
  __range2_6._4_4_ = 0;
  pVVar15 = (VectorView<diligent_spirv_cross::Resource> *)
            (resources.sampled_images.stack_storage.aligned_char + 0x178);
  __end2_6 = diligent_spirv_cross::VectorView<diligent_spirv_cross::Resource>::begin(pVVar15);
  pRVar11 = diligent_spirv_cross::VectorView<diligent_spirv_cross::Resource>::end(pVVar15);
  for (; __end2_6 != pRVar11; __end2_6 = __end2_6 + 1) {
    msg_5.field_2._8_8_ = __end2_6;
    pSVar19 = GetAC(this,__range2_6._4_4_);
    uVar8 = msg_5.field_2._8_8_;
    pCVar13 = StringPool::CopyString
                        ((StringPool *)
                         &UBReflections.
                          super__Vector_base<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (String *)(msg_5.field_2._8_8_ + 0x10));
    SPIRVShaderResourceAttribs::SPIRVShaderResourceAttribs
              (pSVar19,(Compiler *)local_14f8,(Resource *)uVar8,pCVar13,AtomicCounter,0,0);
    __range2_6._4_4_ = __range2_6._4_4_ + 1;
  }
  UVar3 = GetNumACs(this);
  if (__range2_6._4_4_ != UVar3) {
    FormatString<char[26],char[22]>
              ((string *)local_34c8,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CurrAC == GetNumACs()",(char (*) [22])(ulong)UVar3);
    pCVar13 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar13,"SPIRVShaderResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
               ,0x262);
    std::__cxx11::string::~string((string *)local_34c8);
  }
  __range2_7._4_4_ = 0;
  pVVar15 = (VectorView<diligent_spirv_cross::Resource> *)
            (resources.separate_images.stack_storage.aligned_char + 0x178);
  __end2_7 = diligent_spirv_cross::VectorView<diligent_spirv_cross::Resource>::begin(pVVar15);
  pRVar11 = diligent_spirv_cross::VectorView<diligent_spirv_cross::Resource>::end(pVVar15);
  for (; __end2_7 != pRVar11; __end2_7 = __end2_7 + 1) {
    msg_6.field_2._8_8_ = __end2_7;
    pSVar19 = GetSepSmplr(this,__range2_7._4_4_);
    uVar8 = msg_6.field_2._8_8_;
    pCVar13 = StringPool::CopyString
                        ((StringPool *)
                         &UBReflections.
                          super__Vector_base<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (String *)(msg_6.field_2._8_8_ + 0x10));
    SPIRVShaderResourceAttribs::SPIRVShaderResourceAttribs
              (pSVar19,(Compiler *)local_14f8,(Resource *)uVar8,pCVar13,SeparateSampler,0,0);
    __range2_7._4_4_ = __range2_7._4_4_ + 1;
  }
  UVar3 = GetNumSepSmplrs(this);
  if (__range2_7._4_4_ != UVar3) {
    FormatString<char[26],char[33]>
              ((string *)local_3510,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CurrSepSmpl == GetNumSepSmplrs()",(char (*) [33])(ulong)UVar3);
    pCVar13 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar13,"SPIRVShaderResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
               ,0x271);
    std::__cxx11::string::~string((string *)local_3510);
  }
  __range2_8._4_4_ = 0;
  pVVar15 = (VectorView<diligent_spirv_cross::Resource> *)
            (resources.shader_record_buffers.stack_storage.aligned_char + 0x178);
  __end2_8 = diligent_spirv_cross::VectorView<diligent_spirv_cross::Resource>::begin(pVVar15);
  pRVar11 = diligent_spirv_cross::VectorView<diligent_spirv_cross::Resource>::end(pVVar15);
  for (; __end2_8 != pRVar11; __end2_8 = __end2_8 + 1) {
    msg_7.field_2._12_4_ = (__end2_8->type_id).id;
    pSVar18 = diligent_spirv_cross::Compiler::get_type
                        ((Compiler *)local_14f8,(TypeID)msg_7.field_2._12_4_);
    msg_7.field_2._M_local_buf[0xb] = ((pSVar18->image).dim != Buffer) * '\x05' + '\x03';
    pSVar19 = GetSepImg(this,__range2_8._4_4_);
    pCVar13 = StringPool::CopyString
                        ((StringPool *)
                         &UBReflections.
                          super__Vector_base<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,&__end2_8->name);
    SPIRVShaderResourceAttribs::SPIRVShaderResourceAttribs
              (pSVar19,(Compiler *)local_14f8,__end2_8,pCVar13,msg_7.field_2._M_local_buf[0xb],0,0);
    __range2_8._4_4_ = __range2_8._4_4_ + 1;
  }
  UVar3 = GetNumSepImgs(this);
  if (__range2_8._4_4_ != UVar3) {
    FormatString<char[26],char[30]>
              ((string *)local_3568,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CurrSepImg == GetNumSepImgs()",(char (*) [30])(ulong)UVar3);
    pCVar13 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar13,"SPIRVShaderResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
               ,0x285);
    std::__cxx11::string::~string((string *)local_3568);
  }
  __range2_9._4_4_ = 0;
  pVVar15 = (VectorView<diligent_spirv_cross::Resource> *)
            (resources.stage_outputs.stack_storage.aligned_char + 0x178);
  __end2_9 = diligent_spirv_cross::VectorView<diligent_spirv_cross::Resource>::begin(pVVar15);
  pRVar11 = diligent_spirv_cross::VectorView<diligent_spirv_cross::Resource>::end(pVVar15);
  for (; __end2_9 != pRVar11; __end2_9 = __end2_9 + 1) {
    msg_8.field_2._8_8_ = __end2_9;
    pSVar19 = GetInptAtt(this,__range2_9._4_4_);
    uVar8 = msg_8.field_2._8_8_;
    pCVar13 = StringPool::CopyString
                        ((StringPool *)
                         &UBReflections.
                          super__Vector_base<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (String *)(msg_8.field_2._8_8_ + 0x10));
    SPIRVShaderResourceAttribs::SPIRVShaderResourceAttribs
              (pSVar19,(Compiler *)local_14f8,(Resource *)uVar8,pCVar13,InputAttachment,0,0);
    __range2_9._4_4_ = __range2_9._4_4_ + 1;
  }
  UVar3 = GetNumInptAtts(this);
  if (__range2_9._4_4_ != UVar3) {
    FormatString<char[26],char[37]>
              ((string *)local_35b0,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CurrSubpassInput == GetNumInptAtts()",(char (*) [37])(ulong)UVar3);
    pCVar13 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar13,"SPIRVShaderResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
               ,0x294);
    std::__cxx11::string::~string((string *)local_35b0);
  }
  __range2_10._4_4_ = 0;
  pVVar15 = (VectorView<diligent_spirv_cross::Resource> *)
            (resources.atomic_counters.stack_storage.aligned_char + 0x178);
  __end2_10 = diligent_spirv_cross::VectorView<diligent_spirv_cross::Resource>::begin(pVVar15);
  pRVar11 = diligent_spirv_cross::VectorView<diligent_spirv_cross::Resource>::end(pVVar15);
  for (; __end2_10 != pRVar11; __end2_10 = __end2_10 + 1) {
    msg_9.field_2._8_8_ = __end2_10;
    pSVar19 = GetAccelStruct(this,__range2_10._4_4_);
    uVar8 = msg_9.field_2._8_8_;
    pCVar13 = StringPool::CopyString
                        ((StringPool *)
                         &UBReflections.
                          super__Vector_base<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (String *)(msg_9.field_2._8_8_ + 0x10));
    SPIRVShaderResourceAttribs::SPIRVShaderResourceAttribs
              (pSVar19,(Compiler *)local_14f8,(Resource *)uVar8,pCVar13,AccelerationStructure,0,0);
    __range2_10._4_4_ = __range2_10._4_4_ + 1;
  }
  UVar3 = GetNumAccelStructs(this);
  if (__range2_10._4_4_ != UVar3) {
    FormatString<char[26],char[40]>
              ((string *)local_35f8,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CurrAccelStruct == GetNumAccelStructs()",(char (*) [40])(ulong)UVar3)
    ;
    pCVar13 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar13,"SPIRVShaderResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
               ,0x2a3);
    std::__cxx11::string::~string((string *)local_35f8);
  }
  if (CombinedSamplerSuffix != (char *)0x0) {
    pCVar13 = StringPool::CopyString
                        ((StringPool *)
                         &UBReflections.
                          super__Vector_base<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,CombinedSamplerSuffix);
    this->m_CombinedSamplerSuffix = pCVar13;
  }
  Args_1 = (char (*) [44])
           StringPool::CopyString
                     ((StringPool *)
                      &UBReflections.
                       super__Vector_base<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (shaderDesc->super_DeviceObjectAttribs).Name);
  this->m_ShaderName = (char *)Args_1;
  if ((parser.forward_pointer_fixups.stack_storage.aligned_char[0x3f] & 1U) != 0) {
    __range2_11._4_4_ = 0;
    pVVar15 = (VectorView<diligent_spirv_cross::Resource> *)
              (resources.storage_buffers.stack_storage.aligned_char + 0x178);
    __end2_11 = diligent_spirv_cross::VectorView<diligent_spirv_cross::Resource>::begin(pVVar15);
    pRVar11 = diligent_spirv_cross::VectorView<diligent_spirv_cross::Resource>::end(pVVar15);
    for (; __end2_11 != pRVar11; __end2_11 = __end2_11 + 1) {
      bVar2 = diligent_spirv_cross::Compiler::has_decoration
                        ((Compiler *)local_14f8,(ID)(__end2_11->id).id,DecorationHlslSemanticGOOGLE)
      ;
      if (bVar2) {
        psVar17 = diligent_spirv_cross::Compiler::get_decoration_string_abi_cxx11_
                            ((Compiler *)local_14f8,(ID)(__end2_11->id).id,
                             DecorationHlslSemanticGOOGLE);
        this_02 = GetShaderStageInputAttribs(this,__range2_11._4_4_);
        pCVar13 = StringPool::CopyString
                            ((StringPool *)
                             &UBReflections.
                              super__Vector_base<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,psVar17);
        uVar4 = GetDecorationOffset((Compiler *)local_14f8,__end2_11,DecorationLocation);
        SPIRVShaderStageInputAttribs::SPIRVShaderStageInputAttribs(this_02,pCVar13,uVar4);
        __range2_11._4_4_ = __range2_11._4_4_ + 1;
      }
    }
    UVar3 = GetNumShaderStageInputs(this);
    Args_1 = (char (*) [44])(ulong)UVar3;
    if (__range2_11._4_4_ != UVar3) {
      FormatString<char[26],char[44]>
                ((string *)((long)&msg_11.field_2 + 8),(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"CurrStageInput == GetNumShaderStageInputs()",Args_1);
      pCVar13 = (Char *)std::__cxx11::string::c_str();
      Args_1 = (char (*) [44])0x2be;
      DebugAssertionFailed
                (pCVar13,"SPIRVShaderResources",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
                 ,0x2be);
      std::__cxx11::string::~string((string *)(msg_11.field_2._M_local_buf + 8));
    }
  }
  sVar16 = StringPool::GetRemainingSize
                     ((StringPool *)
                      &UBReflections.
                       super__Vector_base<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (sVar16 != 0) {
    FormatString<char[25]>((string *)local_3678,(char (*) [25])"Names pool must be empty");
    pCVar13 = (Char *)std::__cxx11::string::c_str();
    Args_1 = (char (*) [44])0x2c1;
    DebugAssertionFailed
              (pCVar13,"SPIRVShaderResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
               ,0x2c1);
    std::__cxx11::string::~string((string *)local_3678);
  }
  if (shaderDesc->ShaderType == SHADER_TYPE_COMPUTE) {
    for (msg_12.field_2._12_4_ = 0;
        Args_1 = (char (*) [44])std::array<unsigned_int,_3UL>::size(&this->m_ComputeGroupSize),
        (char (*) [44])(ulong)(uint)msg_12.field_2._12_4_ < Args_1;
        msg_12.field_2._12_4_ = msg_12.field_2._12_4_ + 1) {
      uVar4 = diligent_spirv_cross::Compiler::get_execution_mode_argument
                        ((Compiler *)local_14f8,ExecutionModeLocalSize,msg_12.field_2._12_4_);
      pvVar21 = std::array<unsigned_int,_3UL>::operator[]
                          (&this->m_ComputeGroupSize,(ulong)(uint)msg_12.field_2._12_4_);
      *pvVar21 = uVar4;
    }
  }
  bVar2 = std::
          vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
          ::empty((vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
                   *)local_3290);
  if (!bVar2) {
    if ((parser.forward_pointer_fixups.stack_storage.aligned_char[0x3e] & 1U) == 0) {
      FormatString<char[26],char[28]>
                ((string *)((long)&msg_13.field_2 + 8),(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])0xe61d97,(char (*) [28])Args_1);
      pCVar13 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar13,"SPIRVShaderResources",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
                 ,0x2cb);
      std::__cxx11::string::~string((string *)(msg_13.field_2._M_local_buf + 8));
    }
    pacVar22 = (char (*) [36])
               std::
               vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
               ::size((vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
                       *)local_3290);
    UVar3 = GetNumUBs(this);
    if (pacVar22 != (char (*) [36])(ulong)UVar3) {
      FormatString<char[26],char[36]>
                ((string *)local_36c0,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"UBReflections.size() == GetNumUBs()",(char (*) [36])(ulong)UVar3);
      pCVar13 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar13,"SPIRVShaderResources",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
                 ,0x2cc);
      std::__cxx11::string::~string((string *)local_36c0);
    }
    RangeStart = std::
                 vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
                 ::cbegin((vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
                           *)local_3290);
    RangeEnd = std::
               vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
               ::cend((vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
                       *)local_3290);
    RawAllocator = GetRawAllocator();
    ShaderCodeBufferDescX::
    PackArray<__gnu_cxx::__normal_iterator<Diligent::ShaderCodeBufferDescX_const*,std::vector<Diligent::ShaderCodeBufferDescX,std::allocator<Diligent::ShaderCodeBufferDescX>>>>
              ((ShaderCodeBufferDescX *)local_36d0,
               (__normal_iterator<const_Diligent::ShaderCodeBufferDescX_*,_std::vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>_>
                )RangeStart._M_current,
               (__normal_iterator<const_Diligent::ShaderCodeBufferDescX_*,_std::vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>_>
                )RangeEnd._M_current,RawAllocator);
    std::unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>::operator=
              (&this->m_UBReflectionBuffer,
               (unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_> *)
               local_36d0);
    std::unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>::~unique_ptr
              ((unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_> *)
               local_36d0);
  }
  std::vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>::
  ~vector((vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
           *)local_3290);
  StringPool::~StringPool
            ((StringPool *)
             &UBReflections.
              super__Vector_base<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  diligent_spirv_cross::ShaderResources::~ShaderResources((ShaderResources *)&ResourceNamesPoolSize)
  ;
  diligent_spirv_cross::SmallVector<diligent_spirv_cross::EntryPoint,_8UL>::~SmallVector
            ((SmallVector<diligent_spirv_cross::EntryPoint,_8UL> *)&__range1);
  diligent_spirv_cross::Compiler::~Compiler((Compiler *)local_14f8);
  diligent_spirv_cross::Parser::~Parser((Parser *)local_860);
  return;
}

Assistant:

SPIRVShaderResources::SPIRVShaderResources(IMemoryAllocator&     Allocator,
                                           std::vector<uint32_t> spirv_binary,
                                           const ShaderDesc&     shaderDesc,
                                           const char*           CombinedSamplerSuffix,
                                           bool                  LoadShaderStageInputs,
                                           bool                  LoadUniformBufferReflection,
                                           std::string&          EntryPoint) noexcept(false) :
    m_ShaderType{shaderDesc.ShaderType}
{
    // https://github.com/KhronosGroup/SPIRV-Cross/wiki/Reflection-API-user-guide
    diligent_spirv_cross::Parser parser{std::move(spirv_binary)};
    parser.parse();
    const auto ParsedIRSource = parser.get_parsed_ir().source;
    m_IsHLSLSource            = ParsedIRSource.hlsl;
    diligent_spirv_cross::Compiler Compiler{std::move(parser.get_parsed_ir())};

    spv::ExecutionModel ExecutionModel = ShaderTypeToSpvExecutionModel(shaderDesc.ShaderType);
    auto                EntryPoints    = Compiler.get_entry_points_and_stages();
    for (const auto& CurrEntryPoint : EntryPoints)
    {
        if (CurrEntryPoint.execution_model == ExecutionModel)
        {
            if (!EntryPoint.empty())
            {
                LOG_WARNING_MESSAGE("More than one entry point of type ", GetShaderTypeLiteralName(shaderDesc.ShaderType), " found in SPIRV binary for shader '", shaderDesc.Name, "'. The first one ('", EntryPoint, "') will be used.");
            }
            else
            {
                EntryPoint = CurrEntryPoint.name;
            }
        }
    }
    if (EntryPoint.empty())
    {
        LOG_ERROR_AND_THROW("Unable to find entry point of type ", GetShaderTypeLiteralName(shaderDesc.ShaderType), " in SPIRV binary for shader '", shaderDesc.Name, "'");
    }
    Compiler.set_entry_point(EntryPoint, ExecutionModel);

    // The SPIR-V is now parsed, and we can perform reflection on it.
    diligent_spirv_cross::ShaderResources resources = Compiler.get_shader_resources();

    size_t ResourceNamesPoolSize = 0;
    for (const auto& ub : resources.uniform_buffers)
        ResourceNamesPoolSize += GetUBName(Compiler, ub, ParsedIRSource).length() + 1;
    static_assert(Uint32{SPIRVShaderResourceAttribs::ResourceType::NumResourceTypes} == 12, "Please account for the new resource type below");
    for (auto* pResType :
         {
             &resources.storage_buffers,
             &resources.storage_images,
             &resources.sampled_images,
             &resources.atomic_counters,
             &resources.separate_images,
             &resources.separate_samplers,
             &resources.subpass_inputs,
             &resources.acceleration_structures //
         })                                     //
    {
        for (const auto& res : *pResType)
            ResourceNamesPoolSize += res.name.length() + 1;
    }

    if (CombinedSamplerSuffix != nullptr)
    {
        ResourceNamesPoolSize += strlen(CombinedSamplerSuffix) + 1;
    }

    VERIFY_EXPR(shaderDesc.Name != nullptr);
    ResourceNamesPoolSize += strlen(shaderDesc.Name) + 1;

    Uint32 NumShaderStageInputs = 0;

    if (!m_IsHLSLSource || resources.stage_inputs.empty())
        LoadShaderStageInputs = false;
    if (LoadShaderStageInputs)
    {
        const auto& Extensions         = Compiler.get_declared_extensions();
        bool        HlslFunctionality1 = false;
        for (const auto& ext : Extensions)
        {
            HlslFunctionality1 = (ext == "SPV_GOOGLE_hlsl_functionality1");
            if (HlslFunctionality1)
                break;
        }

        if (HlslFunctionality1)
        {
            for (const auto& Input : resources.stage_inputs)
            {
                if (Compiler.has_decoration(Input.id, spv::Decoration::DecorationHlslSemanticGOOGLE))
                {
                    const auto& Semantic = Compiler.get_decoration_string(Input.id, spv::Decoration::DecorationHlslSemanticGOOGLE);
                    ResourceNamesPoolSize += Semantic.length() + 1;
                    ++NumShaderStageInputs;
                }
                else
                {
                    LOG_ERROR_MESSAGE("Shader input '", Input.name, "' does not have DecorationHlslSemanticGOOGLE decoration, which is unexpected as the shader declares SPV_GOOGLE_hlsl_functionality1 extension");
                }
            }
        }
        else
        {
            LoadShaderStageInputs = false;
            if (m_IsHLSLSource)
            {
                LOG_WARNING_MESSAGE("SPIRV byte code of shader '", shaderDesc.Name,
                                    "' does not use SPV_GOOGLE_hlsl_functionality1 extension. "
                                    "As a result, it is not possible to get semantics of shader inputs and map them to proper locations. "
                                    "The shader will still work correctly if all attributes are declared in ascending order without any gaps. "
                                    "Enable SPV_GOOGLE_hlsl_functionality1 in your compiler to allow proper mapping of vertex shader inputs.");
            }
        }
    }

    ResourceCounters ResCounters;
    ResCounters.NumUBs          = static_cast<Uint32>(resources.uniform_buffers.size());
    ResCounters.NumSBs          = static_cast<Uint32>(resources.storage_buffers.size());
    ResCounters.NumImgs         = static_cast<Uint32>(resources.storage_images.size());
    ResCounters.NumSmpldImgs    = static_cast<Uint32>(resources.sampled_images.size());
    ResCounters.NumACs          = static_cast<Uint32>(resources.atomic_counters.size());
    ResCounters.NumSepSmplrs    = static_cast<Uint32>(resources.separate_samplers.size());
    ResCounters.NumSepImgs      = static_cast<Uint32>(resources.separate_images.size());
    ResCounters.NumInptAtts     = static_cast<Uint32>(resources.subpass_inputs.size());
    ResCounters.NumAccelStructs = static_cast<Uint32>(resources.acceleration_structures.size());
    static_assert(Uint32{SPIRVShaderResourceAttribs::ResourceType::NumResourceTypes} == 12, "Please set the new resource type counter here");

    // Resource names pool is only needed to facilitate string allocation.
    StringPool ResourceNamesPool;
    Initialize(Allocator, ResCounters, NumShaderStageInputs, ResourceNamesPoolSize, ResourceNamesPool);

    // Uniform buffer reflections
    std::vector<ShaderCodeBufferDescX> UBReflections;

    {
        Uint32 CurrUB = 0;
        for (const auto& UB : resources.uniform_buffers)
        {
            const auto& name = GetUBName(Compiler, UB, ParsedIRSource);
            const auto& Type = Compiler.get_type(UB.type_id);
            const auto  Size = Compiler.get_declared_struct_size(Type);
            new (&GetUB(CurrUB++)) SPIRVShaderResourceAttribs //
                {
                    Compiler,
                    UB,
                    ResourceNamesPool.CopyString(name),
                    SPIRVShaderResourceAttribs::ResourceType::UniformBuffer,
                    static_cast<Uint32>(Size) //
                };

            if (LoadUniformBufferReflection)
            {
                UBReflections.emplace_back(LoadUBReflection(Compiler, UB, m_IsHLSLSource));
            }
        }
        VERIFY_EXPR(CurrUB == GetNumUBs());
    }

    {
        Uint32 CurrSB = 0;
        for (const auto& SB : resources.storage_buffers)
        {
            auto BufferFlags = Compiler.get_buffer_block_flags(SB.id);
            auto IsReadOnly  = BufferFlags.get(spv::DecorationNonWritable);
            auto ResType     = IsReadOnly ?
                SPIRVShaderResourceAttribs::ResourceType::ROStorageBuffer :
                SPIRVShaderResourceAttribs::ResourceType::RWStorageBuffer;
            const auto& Type   = Compiler.get_type(SB.type_id);
            const auto  Size   = Compiler.get_declared_struct_size(Type);
            const auto  Stride = Compiler.get_declared_struct_size_runtime_array(Type, 1) - Size;
            new (&GetSB(CurrSB++)) SPIRVShaderResourceAttribs //
                {
                    Compiler,
                    SB,
                    ResourceNamesPool.CopyString(SB.name),
                    ResType,
                    static_cast<Uint32>(Size),
                    static_cast<Uint32>(Stride) //
                };
        }
        VERIFY_EXPR(CurrSB == GetNumSBs());
    }

    {
        Uint32 CurrSmplImg = 0;
        for (const auto& SmplImg : resources.sampled_images)
        {
            const auto& type    = Compiler.get_type(SmplImg.type_id);
            auto        ResType = type.image.dim == spv::DimBuffer ?
                SPIRVShaderResourceAttribs::ResourceType::UniformTexelBuffer :
                SPIRVShaderResourceAttribs::ResourceType::SampledImage;
            new (&GetSmpldImg(CurrSmplImg++)) SPIRVShaderResourceAttribs //
                {
                    Compiler,
                    SmplImg,
                    ResourceNamesPool.CopyString(SmplImg.name),
                    ResType //
                };
        }
        VERIFY_EXPR(CurrSmplImg == GetNumSmpldImgs());
    }

    {
        Uint32 CurrImg = 0;
        for (const auto& Img : resources.storage_images)
        {
            const auto& type    = Compiler.get_type(Img.type_id);
            auto        ResType = type.image.dim == spv::DimBuffer ?
                SPIRVShaderResourceAttribs::ResourceType::StorageTexelBuffer :
                SPIRVShaderResourceAttribs::ResourceType::StorageImage;
            new (&GetImg(CurrImg++)) SPIRVShaderResourceAttribs //
                {
                    Compiler,
                    Img,
                    ResourceNamesPool.CopyString(Img.name),
                    ResType //
                };
        }
        VERIFY_EXPR(CurrImg == GetNumImgs());
    }

    {
        Uint32 CurrAC = 0;
        for (const auto& AC : resources.atomic_counters)
        {
            new (&GetAC(CurrAC++)) SPIRVShaderResourceAttribs //
                {
                    Compiler,
                    AC,
                    ResourceNamesPool.CopyString(AC.name),
                    SPIRVShaderResourceAttribs::ResourceType::AtomicCounter //
                };
        }
        VERIFY_EXPR(CurrAC == GetNumACs());
    }

    {
        Uint32 CurrSepSmpl = 0;
        for (const auto& SepSam : resources.separate_samplers)
        {
            new (&GetSepSmplr(CurrSepSmpl++)) SPIRVShaderResourceAttribs //
                {
                    Compiler,
                    SepSam,
                    ResourceNamesPool.CopyString(SepSam.name),
                    SPIRVShaderResourceAttribs::ResourceType::SeparateSampler //
                };
        }
        VERIFY_EXPR(CurrSepSmpl == GetNumSepSmplrs());
    }

    {
        Uint32 CurrSepImg = 0;
        for (const auto& SepImg : resources.separate_images)
        {
            const auto& type    = Compiler.get_type(SepImg.type_id);
            const auto  ResType = type.image.dim == spv::DimBuffer ?
                SPIRVShaderResourceAttribs::ResourceType::UniformTexelBuffer :
                SPIRVShaderResourceAttribs::ResourceType::SeparateImage;

            new (&GetSepImg(CurrSepImg++)) SPIRVShaderResourceAttribs //
                {
                    Compiler,
                    SepImg,
                    ResourceNamesPool.CopyString(SepImg.name),
                    ResType //
                };
        }
        VERIFY_EXPR(CurrSepImg == GetNumSepImgs());
    }

    {
        Uint32 CurrSubpassInput = 0;
        for (const auto& SubpassInput : resources.subpass_inputs)
        {
            new (&GetInptAtt(CurrSubpassInput++)) SPIRVShaderResourceAttribs //
                {
                    Compiler,
                    SubpassInput,
                    ResourceNamesPool.CopyString(SubpassInput.name),
                    SPIRVShaderResourceAttribs::ResourceType::InputAttachment //
                };
        }
        VERIFY_EXPR(CurrSubpassInput == GetNumInptAtts());
    }

    {
        Uint32 CurrAccelStruct = 0;
        for (const auto& AccelStruct : resources.acceleration_structures)
        {
            new (&GetAccelStruct(CurrAccelStruct++)) SPIRVShaderResourceAttribs //
                {
                    Compiler,
                    AccelStruct,
                    ResourceNamesPool.CopyString(AccelStruct.name),
                    SPIRVShaderResourceAttribs::ResourceType::AccelerationStructure //
                };
        }
        VERIFY_EXPR(CurrAccelStruct == GetNumAccelStructs());
    }

    static_assert(Uint32{SPIRVShaderResourceAttribs::ResourceType::NumResourceTypes} == 12, "Please initialize SPIRVShaderResourceAttribs for the new resource type here");

    if (CombinedSamplerSuffix != nullptr)
    {
        m_CombinedSamplerSuffix = ResourceNamesPool.CopyString(CombinedSamplerSuffix);
    }

    m_ShaderName = ResourceNamesPool.CopyString(shaderDesc.Name);

    if (LoadShaderStageInputs)
    {
        Uint32 CurrStageInput = 0;
        for (const auto& Input : resources.stage_inputs)
        {
            if (Compiler.has_decoration(Input.id, spv::Decoration::DecorationHlslSemanticGOOGLE))
            {
                const auto& Semantic = Compiler.get_decoration_string(Input.id, spv::Decoration::DecorationHlslSemanticGOOGLE);
                new (&GetShaderStageInputAttribs(CurrStageInput++)) SPIRVShaderStageInputAttribs //
                    {
                        ResourceNamesPool.CopyString(Semantic),
                        GetDecorationOffset(Compiler, Input, spv::Decoration::DecorationLocation) //
                    };
            }
        }
        VERIFY_EXPR(CurrStageInput == GetNumShaderStageInputs());
    }

    VERIFY(ResourceNamesPool.GetRemainingSize() == 0, "Names pool must be empty");

    if (shaderDesc.ShaderType == SHADER_TYPE_COMPUTE)
    {
        for (uint32_t i = 0; i < m_ComputeGroupSize.size(); ++i)
            m_ComputeGroupSize[i] = Compiler.get_execution_mode_argument(spv::ExecutionModeLocalSize, i);
    }

    if (!UBReflections.empty())
    {
        VERIFY_EXPR(LoadUniformBufferReflection);
        VERIFY_EXPR(UBReflections.size() == GetNumUBs());
        m_UBReflectionBuffer = ShaderCodeBufferDescX::PackArray(UBReflections.cbegin(), UBReflections.cend(), GetRawAllocator());
    }
    //LOG_INFO_MESSAGE(DumpResources());
}